

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O0

void __thiscall OptionRecord::~OptionRecord(OptionRecord *this)

{
  OptionRecord *in_RDI;
  
  ~OptionRecord(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~OptionRecord() {}